

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8Helper.h
# Opt level: O3

HRESULT utf8::WideStringToNarrow<void*(*)(unsigned_long)>
                  (_func_void_ptr_unsigned_long *allocator,LPCWSTR sourceString,size_t sourceCount,
                  LPSTR *destStringPtr,size_t *destCount,size_t *allocateCount)

{
  size_t cbDest;
  utf8char_t *dest;
  size_t sVar1;
  HMODULE pVVar2;
  utf8char_t *lpLibFileName;
  HRESULT HVar3;
  
  HVar3 = -0x7ff8fff2;
  if (sourceCount < 0xffffffff) {
    cbDest = sourceCount * 3 + 1;
    dest = (utf8char_t *)(*allocator)(cbDest);
    if (dest != (utf8char_t *)0x0) {
      lpLibFileName = dest;
      sVar1 = EncodeIntoAndNullTerminate<(utf8::Utf8EncodingKind)1>
                        (dest,cbDest,sourceString,(charcount_t)sourceCount);
      if (cbDest < sVar1) {
        WideStringToNarrow<void*(*)(unsigned_long)>();
        pVVar2 = LoadLibraryExA((LPCSTR)lpLibFileName,(HANDLE)0x0,0);
        return (HRESULT)pVVar2;
      }
      *destStringPtr = (LPSTR)dest;
      *destCount = sVar1;
      HVar3 = 0;
      if (allocateCount != (size_t *)0x0) {
        *allocateCount = sVar1;
        HVar3 = 0;
      }
    }
  }
  return HVar3;
}

Assistant:

HRESULT WideStringToNarrow(
        _In_ AllocatorFunction allocator,
        _In_ LPCWSTR sourceString,
        size_t sourceCount,
        _Out_ LPSTR* destStringPtr,
        _Out_ size_t* destCount,
        size_t* allocateCount = nullptr)
    {
        size_t cchSourceString = sourceCount;

        if (cchSourceString >= MAXUINT32)
        {
            return E_OUTOFMEMORY;
        }

        // Multiply by 3 for max size of encoded character, plus 1 for the null terminator (don't need 3 bytes for the null terminator)
        size_t cbDestString = (cchSourceString * 3) + 1;

        // Check for overflow- cbDestString should be >= cchSourceString
        if (cbDestString < cchSourceString)
        {
            return E_OUTOFMEMORY;
        }

        utf8char_t* destString = (utf8char_t*)allocator(cbDestString);
        if (destString == nullptr)
        {
            return E_OUTOFMEMORY;
        }

        size_t cbEncoded = utf8::EncodeIntoAndNullTerminate<utf8::Utf8EncodingKind::TrueUtf8>(destString, cbDestString, sourceString, static_cast<charcount_t>(cchSourceString));
        Assert(cbEncoded <= cbDestString);
        static_assert(sizeof(utf8char_t) == sizeof(char), "Needs to be valid for cast");
        *destStringPtr = (char*)destString;
        *destCount = cbEncoded;
        if (allocateCount != nullptr)
        {
            *allocateCount = cbEncoded;
        }

        return S_OK;
    }